

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

int __thiscall
zmq::thread_ctx_t::get(thread_ctx_t *this,int option_,void *optval_,size_t *optvallen_)

{
  ulong uVar1;
  int iVar2;
  char *__nptr;
  ulong uVar3;
  void *__src;
  size_t __n;
  int *piVar4;
  ulong *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  scoped_lock_t locker_2;
  scoped_lock_t locker_1;
  scoped_lock_t locker;
  int *value;
  bool is_int;
  mutex_t *in_stack_ffffffffffffff88;
  scoped_lock_t *in_stack_ffffffffffffff90;
  
  if (in_ESI == 4) {
    if (*in_RCX == 4) {
      scoped_lock_t::scoped_lock_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      *in_RDX = *(int *)(in_RDI + 0x34);
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1d5330);
      return 0;
    }
  }
  else if (in_ESI == 9) {
    if (*in_RCX == 4) {
      scoped_lock_t::scoped_lock_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      __nptr = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(__nptr);
      *in_RDX = iVar2;
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1d5381);
      return 0;
    }
    uVar1 = *in_RCX;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar1) {
      scoped_lock_t::scoped_lock_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      __src = (void *)std::__cxx11::string::data();
      __n = std::__cxx11::string::size();
      memcpy(in_RDX,__src,__n);
      scoped_lock_t::~scoped_lock_t((scoped_lock_t *)0x1d540a);
      return 0;
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return -1;
}

Assistant:

int zmq::thread_ctx_t::get (int option_,
                            void *optval_,
                            const size_t *optvallen_)
{
    const bool is_int = (*optvallen_ == sizeof (int));
    int *value = static_cast<int *> (optval_);

    switch (option_) {
        case ZMQ_THREAD_SCHED_POLICY:
            if (is_int) {
                scoped_lock_t locker (_opt_sync);
                *value = _thread_sched_policy;
                return 0;
            }
            break;

        case ZMQ_THREAD_NAME_PREFIX:
            if (is_int) {
                scoped_lock_t locker (_opt_sync);
                *value = atoi (_thread_name_prefix.c_str ());
                return 0;
            } else if (*optvallen_ >= _thread_name_prefix.size ()) {
                scoped_lock_t locker (_opt_sync);
                memcpy (optval_, _thread_name_prefix.data (),
                        _thread_name_prefix.size ());
                return 0;
            }
            break;
    }

    errno = EINVAL;
    return -1;
}